

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiskin.cpp
# Opt level: O2

void setupBsp(BSP<int> *tAlg,uint n,uint p,int seed,IntVector *input,
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *bspInputs,
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *bspOutputs)

{
  pointer pvVar1;
  pointer piVar2;
  ulong __n;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar3;
  Superstep<int> *pSVar4;
  ulong uVar5;
  uint i;
  ulong uVar6;
  ulong __n_00;
  uint uVar7;
  bool bVar8;
  SuperstepPointer s1;
  SuperstepPointer s2;
  UTimer superstepCreator;
  random_device randomDevice;
  _Vector_base<int,_std::allocator<int>_> local_1590;
  Superstep<int> *local_1578;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1570;
  BSP<int> *local_1568;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_1560;
  Superstep<int> *local_1558;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1550;
  IntVector *local_1548;
  UTimer local_1540;
  _Any_data local_1508;
  code *local_14f8;
  code *local_14f0;
  _Any_data local_14e8;
  code *local_14d8;
  code *local_14d0;
  _Any_data local_14c8;
  code *local_14b8;
  code *local_14b0;
  _Any_data local_14a8;
  code *local_1498;
  code *local_1490;
  _Any_data local_1488;
  code *local_1478;
  code *local_1470;
  _Any_data local_1468;
  code *local_1458;
  code *local_1450;
  SuperstepPointer local_1448;
  SuperstepPointer local_1438;
  SuperstepPointer local_1428;
  string local_1418;
  string local_13f8;
  string local_13d8;
  random_device local_13b8;
  
  local_1568 = tAlg;
  local_1560 = bspInputs;
  std::random_device::random_device(&local_13b8);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_1540,(ulong)n,(allocator_type *)&local_1590
            );
  std::vector<int,_std::allocator<int>_>::_M_move_assign(input,&local_1540);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_1540);
  std::__cxx11::string::string
            ((string *)&local_13d8,"Creating random vector",(allocator *)&local_1590);
  UTimer::UTimer(&local_1540,&local_13d8);
  std::__cxx11::string::~string((string *)&local_13d8);
  if (seed == -1) {
    seed = std::random_device::_M_getval();
  }
  createRandomVector(input,seed);
  UTimer::~UTimer(&local_1540);
  std::__cxx11::string::string
            ((string *)&local_13f8,"Creating BSP input vectors",(allocator *)&local_1590);
  UTimer::UTimer(&local_1540,&local_13f8);
  std::__cxx11::string::~string((string *)&local_13f8);
  __n_00 = (ulong)p;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_1590,__n_00,(allocator_type *)&local_1578);
  local_1548 = input;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_move_assign(local_1560,&local_1590);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_1590);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_1590,__n_00,(allocator_type *)&local_1578);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_move_assign(bspOutputs,&local_1590);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_1590);
  pvVar3 = local_1560;
  __n = (ulong)n / (ulong)p;
  for (uVar6 = 0; uVar6 != __n_00; uVar6 = uVar6 + 1) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_1590,__n,(allocator_type *)&local_1578);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((pvVar3->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar6,&local_1590);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1590);
    pvVar1 = (pvVar3->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar2 = (local_1548->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar5 = 0; uVar5 < __n; uVar5 = uVar5 + 1) {
      *(int *)(*(long *)&pvVar1[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + uVar5 * 4) =
           piVar2[(uint)((int)uVar6 * (int)__n + (int)uVar5)];
    }
  }
  UTimer::~UTimer(&local_1540);
  std::__cxx11::string::string((string *)&local_1418,"Creating supersteps",(allocator *)&local_1590)
  ;
  UTimer::UTimer(&local_1540,&local_1418);
  std::__cxx11::string::~string((string *)&local_1418);
  pSVar4 = (Superstep<int> *)operator_new(0x188);
  Superstep<int>::Superstep(pSVar4);
  std::__shared_ptr<Superstep<int>,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Superstep<int>,void>
            ((__shared_ptr<Superstep<int>,(__gnu_cxx::_Lock_policy)2> *)&local_1590,pSVar4);
  uVar7 = p;
  while( true ) {
    bVar8 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar8) break;
    local_1468._M_unused._M_object = (void *)0x0;
    local_1468._8_8_ = 0;
    local_1450 = std::
                 _Function_handler<void_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:189:4)>
                 ::_M_invoke;
    local_1458 = std::
                 _Function_handler<void_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:189:4)>
                 ::_M_manager;
    local_14c8._8_8_ = 0;
    local_14c8._4_4_ = 0;
    local_14c8._0_4_ = p;
    local_14b0 = std::
                 _Function_handler<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:196:4)>
                 ::_M_invoke;
    local_14b8 = std::
                 _Function_handler<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:196:4)>
                 ::_M_manager;
    Superstep<int>::addActivity
              ((Superstep<int> *)local_1590._M_impl.super__Vector_impl_data._M_start,
               (ActivityFunction *)&local_1468,
               (function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
                *)&local_14c8);
    std::_Function_base::~_Function_base((_Function_base *)&local_14c8);
    std::_Function_base::~_Function_base((_Function_base *)&local_1468);
  }
  local_1428.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1590._M_impl.super__Vector_impl_data._M_start;
  local_1428.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_1590._M_impl.super__Vector_impl_data._M_finish;
  local_1590._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1590._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  BSP<int>::addSuperstep(local_1568,&local_1428);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1428.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  pSVar4 = (Superstep<int> *)operator_new(0x188);
  Superstep<int>::Superstep(pSVar4);
  std::__shared_ptr<Superstep<int>,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Superstep<int>,void>
            ((__shared_ptr<Superstep<int>,(__gnu_cxx::_Lock_policy)2> *)&local_1578,pSVar4);
  uVar7 = p;
  while( true ) {
    bVar8 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar8) break;
    local_1488._M_unused._M_object = (void *)0x0;
    local_1488._8_8_ = 0;
    local_1470 = std::
                 _Function_handler<void_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:220:4)>
                 ::_M_invoke;
    local_1478 = std::
                 _Function_handler<void_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:220:4)>
                 ::_M_manager;
    local_14e8._8_8_ = 0;
    local_14e8._4_4_ = 0;
    local_14e8._0_4_ = p;
    local_14d0 = std::
                 _Function_handler<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:224:5)>
                 ::_M_invoke;
    local_14d8 = std::
                 _Function_handler<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:224:5)>
                 ::_M_manager;
    Superstep<int>::addActivity
              (local_1578,(ActivityFunction *)&local_1488,
               (function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
                *)&local_14e8);
    std::_Function_base::~_Function_base((_Function_base *)&local_14e8);
    std::_Function_base::~_Function_base((_Function_base *)&local_1488);
  }
  local_1438.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1578;
  local_1438.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_1570._M_pi;
  local_1578 = (Superstep<int> *)0x0;
  _Stack_1570._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BSP<int>::addSuperstep(local_1568,&local_1438);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1438.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  pSVar4 = (Superstep<int> *)operator_new(0x188);
  Superstep<int>::Superstep(pSVar4);
  std::__shared_ptr<Superstep<int>,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Superstep<int>,void>
            ((__shared_ptr<Superstep<int>,(__gnu_cxx::_Lock_policy)2> *)&local_1558,pSVar4);
  uVar7 = p;
  while( true ) {
    bVar8 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar8) break;
    local_14a8._M_unused._M_object = (void *)0x0;
    local_14a8._8_8_ = 0;
    local_1490 = std::
                 _Function_handler<void_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:262:4)>
                 ::_M_invoke;
    local_1498 = std::
                 _Function_handler<void_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:262:4)>
                 ::_M_manager;
    local_1508._8_8_ = 0;
    local_1508._4_4_ = 0;
    local_1508._0_4_ = p;
    local_14f0 = std::
                 _Function_handler<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:266:5)>
                 ::_M_invoke;
    local_14f8 = std::
                 _Function_handler<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:266:5)>
                 ::_M_manager;
    Superstep<int>::addActivity
              (local_1558,(ActivityFunction *)&local_14a8,
               (function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
                *)&local_1508);
    std::_Function_base::~_Function_base((_Function_base *)&local_1508);
    std::_Function_base::~_Function_base((_Function_base *)&local_14a8);
  }
  local_1448.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1558;
  local_1448.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_1550._M_pi;
  local_1558 = (Superstep<int> *)0x0;
  _Stack_1550._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BSP<int>::addSuperstep(local_1568,&local_1448);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1448.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1550);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1570);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_1590._M_impl.super__Vector_impl_data._M_finish);
  UTimer::~UTimer(&local_1540);
  std::random_device::~random_device(&local_13b8);
  return;
}

Assistant:

void setupBsp (BSP<int> &tAlg, uint n, uint p, int seed, IntVector &input,
				std::vector<IntVector> &bspInputs, std::vector<IntVector> &bspOutputs) {
	
	std::random_device randomDevice;
	input	= IntVector	(n);
	
	{
		UTimer randomVector ("Creating random vector");
		createRandomVector (input, (seed==-1) ? randomDevice() : seed);
	}


	{
		UTimer bspInputVectors ("Creating BSP input vectors");
		
		bspInputs	= std::vector<IntVector> (p);
		bspOutputs	= std::vector<IntVector> (p);

		uint actInputLen	= n/p;
		for (uint i=0; i<p; i++) {
			bspInputs[i]	= IntVector (actInputLen);
			auto &vI		= bspInputs[i];
			for (uint j=0; j<actInputLen; j++) {
				vI[j]	= input[(actInputLen*i)+j];
			}
		}
	}


	UTimer superstepCreator ("Creating supersteps");


	// ============================================================
	// ============================================================
	// Superstep 0

	BSP<int>::SuperstepPointer s0	= BSP<int>::SuperstepPointer (new Superstep<int> ());

	for (uint i= 0; i<p; i++) {
		s0->addActivity (
			[] (uint activityIndex, IntVector &actInput) {
				TISKIN_PRINT_V ("Input vector of activity " << activityIndex << ": ", actInput, "");
				std::sort (actInput.begin(), actInput.end());
				mapMutex.lock ();
				s0VectorsMap[activityIndex]	= actInput;
				mapMutex.unlock ();
			},
			[p] (uint activityIndex, IntVector &elements) {
				IntCommunicationProtocols cp (p);
				cp[0]	= IntVector (p+1);
				findOutSeparators (std::ref(cp[0]), std::ref(elements), p+1);
				for (uint i=1; i<p; i++) {
					cp[i]	= IntVector (p+1);
					cp[i]	= cp[0];
				}
				return cp;
			}
		);
	}

	tAlg.addSuperstep (std::move(s0));


	// ============================================================
	// ============================================================
	// Superstep 1 

	BSP<int>::SuperstepPointer s1	= BSP<int>::SuperstepPointer (new Superstep<int> ());

	for (uint i= 0; i<p; i++) {
		s1->addActivity (
			[] (uint activityIndex, IntVector &actInput) {
				TISKIN_PRINT_V ("Input vector of activity " << activityIndex << ": ", actInput, "");
				std::sort (actInput.begin(), actInput.end());
			},
			([p] (uint activityIndex, IntVector &commElements) {
				std::vector<IntVector> cp (p);
				IntVector separators (p+1);
				findOutSeparators (std::ref(separators), std::ref(commElements), p+1);
				
				mapMutex.lock ();
				IntVector &pi	= s0VectorsMap[activityIndex];
				mapMutex.unlock ();
				size_t i				= 0;	// Index for 'pi' vector
				size_t j				= 1;	// Index for 'separators' vector
				size_t k				= 0;	// Index for 'cp' vector

				while (i < pi.size()) {
					cp[k]	= IntVector ();
					while (i < pi.size() && pi[i] <= separators[j]) {
						cp[k].emplace_back (pi[i]);
						i++;
					}
					j++;
					k++;
				}

				return cp;
			})
		);
	}

	tAlg.addSuperstep (std::move(s1));


	// ============================================================
	// ============================================================
	// Superstep 2

	BSP<int>::SuperstepPointer s2	= BSP<int>::SuperstepPointer (new Superstep<int> ());

	for (uint i= 0; i<p; i++) {
		s2->addActivity (
			[] (uint activityIndex, IntVector &actInput) {
				TISKIN_PRINT_V ("Input vector of activity " << activityIndex << ": ", actInput, "");
				std::sort (actInput.begin(), actInput.end());
			},
			([p] (uint activityIndex, IntVector &elements) {
				std::vector<IntVector> cp (p);
				for (auto el: elements) {
					cp[activityIndex].emplace_back (el);
				}
				return cp;
			})
		);
	}

	tAlg.addSuperstep (std::move(s2));
}